

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es31fSRGBDecodeTests.cpp
# Opt level: O0

void __thiscall
deqp::gles31::Functional::anon_unknown_0::DecodeSamplerCase::setupTest(DecodeSamplerCase *this)

{
  Vec4 local_a0;
  undefined1 local_90 [8];
  FragmentShaderParameters shaderParameters;
  DecodeSamplerCase *this_local;
  
  shaderParameters.uniformsToToggle.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)this;
  FragmentShaderParameters::FragmentShaderParameters
            ((FragmentShaderParameters *)local_90,SHADEROUTPUTS_ONE,SHADERUNIFORMS_ONE,
             (ComparisonFunction *)0x0,BLENDING_NOT_REQUIRED,TOGGLING_NOT_REQUIRED);
  getColorReferenceLinear();
  SRGBTestCase::addTexture
            (&this->super_SRGBTestCase,TEXTURETYPE_2D,0x80,0x80,&local_a0,MIRRORED_REPEAT_GL,
             MIRRORED_REPEAT_GL,LINEAR,LINEAR,SRGBDECODE_SKIP_DECODE);
  SRGBTestCase::addSampler
            (&this->super_SRGBTestCase,MIRRORED_REPEAT_GL,MIRRORED_REPEAT_GL,LINEAR,LINEAR,
             SRGBDECODE_DECODE);
  SRGBTestCase::addShaderProgram(&this->super_SRGBTestCase,(FragmentShaderParameters *)local_90);
  SRGBTestCase::bindSamplerToTexture(&this->super_SRGBTestCase,0,0,0x84c0);
  SRGBTestCase::activateSampler(&this->super_SRGBTestCase,0,true);
  SRGBTestCase::setSamplingLocations(&this->super_SRGBTestCase,0,0);
  SRGBTestCase::setSamplingGroup(&this->super_SRGBTestCase,SHADERSAMPLINGGROUP_TEXTURE);
  FragmentShaderParameters::~FragmentShaderParameters((FragmentShaderParameters *)local_90);
  return;
}

Assistant:

void DecodeSamplerCase::setupTest (void)
{
	// TEST STEPS:
	//	- create and set texture_a to DECODE_SKIP_EXT
	//	- upload texture to the GPU and bind to sampler
	//	- sample texture using texture*()
	//	- read texel values back to the CPU
	//	- compare the texel values, should be in sampler format (linear)

	FragmentShaderParameters shaderParameters(SHADEROUTPUTS_ONE, SHADERUNIFORMS_ONE, NULL, BLENDING_NOT_REQUIRED, TOGGLING_NOT_REQUIRED);

	this->addTexture(	TEXTURETYPE_2D,
						TestDimensions::WIDTH,
						TestDimensions::HEIGHT,
						getColorReferenceLinear(),
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_SKIP_DECODE);

	this->addSampler(	tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::MIRRORED_REPEAT_GL,
						tcu::Sampler::LINEAR,
						tcu::Sampler::LINEAR,
						SRGBDECODE_DECODE);

	this->addShaderProgram(shaderParameters);

	this->bindSamplerToTexture(0, 0, GL_TEXTURE0);
	this->activateSampler(0, true);

	this->setSamplingLocations(TestSamplingPositions::X_POS, TestSamplingPositions::Y_POS);
	this->setSamplingGroup(SHADERSAMPLINGGROUP_TEXTURE);
}